

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd_hevc.c
# Opt level: O0

int parse_ptl(GetBitContext *gb,PTL *ptl,int max_num_sub_layers)

{
  uint8_t uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint8_t *puVar7;
  byte bVar8;
  int iVar9;
  uint local_dc;
  uint local_d8;
  uint local_d4;
  uint local_d0;
  int i;
  int max_num_sub_layers_local;
  PTL *ptl_local;
  GetBitContext *gb_local;
  uint local_ac;
  uint8_t result_1;
  uint32_t index_1;
  uint local_9c;
  uint8_t result;
  uint32_t index;
  uint32_t re_cache_1;
  uint8_t *re_buffer_1;
  uint32_t re_size_plus8_2;
  uint32_t re_index_2;
  int tmp_1;
  uint32_t re_cache;
  uint8_t *re_buffer;
  uint32_t re_size_plus8;
  uint32_t re_index;
  int tmp;
  uint32_t re_size_plus8_1;
  uint32_t re_index_1;
  
  iVar9 = decode_profile_tier_level(gb,&ptl->general_ptl);
  if ((iVar9 < 0) ||
     ((int)(gb->size_in_bits - gb->index) < (int)((uint)(0 < max_num_sub_layers + -1) * 0x10 + 8)))
  {
    fprintf(_stderr,"PTL information too short\n");
    gb_local._4_4_ = -1;
  }
  else {
    uVar2 = gb->index;
    local_d4 = gb->size_in_bits_plus8;
    puVar7 = gb->buffer;
    uVar3 = *(uint *)(puVar7 + (uVar2 >> 3));
    uVar4 = *(uint *)(puVar7 + (uVar2 >> 3));
    uVar5 = *(uint *)(puVar7 + (uVar2 >> 3));
    uVar6 = *(uint *)(puVar7 + (uVar2 >> 3));
    if (uVar2 + 8 < local_d4) {
      local_d4 = uVar2 + 8;
    }
    gb->index = local_d4;
    (ptl->general_ptl).level_idc =
         (uint8_t)(((((uVar3 & 0xff) << 8 | uVar4 >> 8 & 0xff) << 0x10 |
                    (uVar5 >> 0x10 & 0xff) << 8 | uVar6 >> 0x18) << ((byte)uVar2 & 7)) >> 0x18);
    for (local_d0 = 0; (int)local_d0 < max_num_sub_layers + -1; local_d0 = local_d0 + 1) {
      local_9c = gb->index;
      uVar1 = gb->buffer[local_9c >> 3];
      bVar8 = (byte)local_9c;
      if (gb->index < gb->size_in_bits_plus8) {
        local_9c = local_9c + 1;
      }
      gb->index = local_9c;
      ptl->sub_layer_profile_present_flag[(int)local_d0] =
           (uint8_t)((int)(uint)(byte)(uVar1 << (bVar8 & 7)) >> 7);
      local_ac = gb->index;
      uVar1 = gb->buffer[local_ac >> 3];
      bVar8 = (byte)local_ac;
      if (gb->index < gb->size_in_bits_plus8) {
        local_ac = local_ac + 1;
      }
      gb->index = local_ac;
      ptl->sub_layer_level_present_flag[(int)local_d0] =
           (uint8_t)((int)(uint)(byte)(uVar1 << (bVar8 & 7)) >> 7);
    }
    if (1 < max_num_sub_layers) {
      for (local_d0 = max_num_sub_layers + -1; (int)local_d0 < 8; local_d0 = local_d0 + 1) {
        local_d8 = gb->size_in_bits_plus8;
        if (gb->index + 2 < local_d8) {
          local_d8 = gb->index + 2;
        }
        gb->index = local_d8;
      }
    }
    for (local_d0 = 0; (int)local_d0 < max_num_sub_layers + -1; local_d0 = local_d0 + 1) {
      if ((ptl->sub_layer_profile_present_flag[(int)local_d0] != '\0') &&
         (iVar9 = decode_profile_tier_level(gb,ptl->sub_layer_ptl + (int)local_d0), iVar9 < 0)) {
        fprintf(_stderr,"PTL information for sublayer %i too short\n",(ulong)local_d0);
        return -1;
      }
      if (ptl->sub_layer_level_present_flag[(int)local_d0] != '\0') {
        if ((int)(gb->size_in_bits - gb->index) < 8) {
          fprintf(_stderr,"Not enough data for sublayer %i level_idc\n",(ulong)local_d0);
          return -1;
        }
        uVar2 = gb->index;
        local_dc = gb->size_in_bits_plus8;
        puVar7 = gb->buffer;
        uVar3 = *(uint *)(puVar7 + (uVar2 >> 3));
        uVar4 = *(uint *)(puVar7 + (uVar2 >> 3));
        uVar5 = *(uint *)(puVar7 + (uVar2 >> 3));
        uVar6 = *(uint *)(puVar7 + (uVar2 >> 3));
        if (uVar2 + 8 < local_dc) {
          local_dc = uVar2 + 8;
        }
        gb->index = local_dc;
        ptl->sub_layer_ptl[(int)local_d0].level_idc =
             (uint8_t)(((((uVar3 & 0xff) << 8 | uVar4 >> 8 & 0xff) << 0x10 |
                        (uVar5 >> 0x10 & 0xff) << 8 | uVar6 >> 0x18) << ((byte)uVar2 & 7)) >> 0x18);
      }
    }
    gb_local._4_4_ = 0;
  }
  return gb_local._4_4_;
}

Assistant:

static int parse_ptl(GetBitContext *gb, PTL *ptl, int max_num_sub_layers)
{
    int i;
    if (decode_profile_tier_level(gb, &ptl->general_ptl) < 0 || get_bits_left(gb) < 8 + (8 * 2 * (max_num_sub_layers - 1 > 0))) {
        fprintf(stderr, "PTL information too short\n");
        return -1;
    }

    ptl->general_ptl.level_idc = (uint8_t)get_bits(gb, 8);

    for (i = 0; i < max_num_sub_layers - 1; i++)
    {
        ptl->sub_layer_profile_present_flag[i] = (uint8_t)get_bits1(gb);
        ptl->sub_layer_level_present_flag[i]   = (uint8_t)get_bits1(gb);
    }

    if (max_num_sub_layers > 1)
        for (i = max_num_sub_layers - 1; i < 8; i++)
            skip_bits(gb, 2); // reserved_zero_2bits[i]
    for (i = 0; i < max_num_sub_layers - 1; i++)
    {
        if (ptl->sub_layer_profile_present_flag[i] && decode_profile_tier_level(gb, &ptl->sub_layer_ptl[i]) < 0)
        {
            fprintf(stderr, "PTL information for sublayer %i too short\n", i);
            return -1;
        }
        if (ptl->sub_layer_level_present_flag[i])
        {
            if (get_bits_left(gb) < 8)
            {
                fprintf(stderr, "Not enough data for sublayer %i level_idc\n", i);
                return -1;
            }
            else
                ptl->sub_layer_ptl[i].level_idc = (uint8_t)get_bits(gb, 8);
        }
    }

    return 0;
}